

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klvwalk.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  undefined8 uVar3;
  long *plVar4;
  Dictionary *pDVar5;
  ILogSink *pIVar6;
  int iVar7;
  code *pcVar8;
  code *pcVar9;
  _List_node_base *p_Var10;
  Result_t result;
  CommandOptions Options;
  RIP RIP;
  FileReaderFactory defaultFactory;
  Partition TmpPart;
  OP1aHeader Header;
  allocator<char> local_721;
  _List_node_base *local_720;
  code *local_718;
  code *local_710;
  code *local_708;
  int local_700 [2];
  undefined8 local_6f8;
  CommandOptions local_698;
  undefined1 local_678 [16];
  undefined4 local_668;
  undefined4 uStack_664;
  char *local_660;
  char *pcStack_658;
  undefined **local_650;
  char *local_648;
  char *pcStack_640;
  undefined1 local_638;
  FrameBuffer local_630 [40];
  Dictionary *local_608;
  undefined **local_600;
  _List_node_base local_5f8;
  ulong local_5e8;
  code *local_5e0;
  void **local_5d8 [2];
  void *local_5c8 [11];
  _IO_FILE local_570;
  undefined1 *local_3f0;
  undefined1 local_3e8 [152];
  void *local_350;
  undefined1 local_238 [104];
  IFileReader local_1d0 [104];
  Result_t local_168 [104];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  CommandOptions::CommandOptions(&local_698,argc,argv);
  pFVar1 = _stdout;
  if (local_698.version_flag == true) {
    uVar3 = ASDCP::Version();
    fprintf(pFVar1,
            "\n%s (asdcplib %s)\n\nCopyright (c) 2005-2021 John Hurst\n%s is part of the asdcplib DCP tools package.\nasdcplib may be copied only under the terms of the license found at\nthe top of every file in the asdcplib distribution kit.\n\nSpecify the -h (help) option for further information about %s\n\n"
            ,"klvwalk",uVar3,"klvwalk","klvwalk");
  }
  if (local_698.help_flag == true) {
    fprintf(_stdout,
            "USAGE: %s [-r|-p] [-v] <input-file> [<input-file2> ...]\n\n       %s [-h|-help] [-V]\n\n  -h | -help   - Show help\n  -r           - When KLV data is an MXF OPAtom or OP 1a file, display headers\n  -p           - Display partition headers by walking the RIP\n  -s           - Allow skipping huge packets when scanning\n  -v           - Verbose. Prints informative messages to stderr\n  -V           - Show version information\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
            ,"klvwalk");
  }
  iVar7 = 0;
  if ((local_698.version_flag == false) && (iVar7 = 0, local_698.help_flag == false)) {
    if (local_698.error_flag == true) {
      main_cold_3();
      iVar7 = 3;
    }
    else {
      Kumu::Result_t::Result_t((Result_t *)local_700,(Result_t *)Kumu::RESULT_OK);
      local_5e0 = ASDCP::MXF::OPAtomIndexFooter::OPAtomIndexFooter;
      local_720 = local_698.inFileList.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
      if (local_698.inFileList.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_698.inFileList
          && -1 < local_700[0]) {
        local_708 = Kumu::Result_t::Result_t;
        pcVar8 = ASDCP::MXF::RIP::InitFromFile;
        local_718 = _ITM_registerTMCloneTable;
        local_710 = ASDCP::MXF::RIP::InitFromFile;
        do {
          plVar4 = (long *)Kumu::FileReaderFactory::CreateFileReader();
          if (local_698.verbose_flag == true) {
            main_cold_1();
          }
          if (local_698.read_mxf_flag == true) {
            pDVar5 = (Dictionary *)ASDCP::DefaultCompositeDict();
            ASDCP::MXF::OP1aHeader::OP1aHeader((OP1aHeader *)local_3e8,pDVar5);
            local_678._8_8_ = (char *)0x0;
            local_668 = 0;
            local_648 = (char *)0x0;
            pcStack_640 = (char *)0x0;
            local_638 = 0;
            local_660 = (char *)0x0;
            pcStack_658 = (char *)0x0;
            local_650 = &PTR__IArchive_00109be8;
            local_678._0_8_ = pcVar8;
            ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)(local_678 + 0x48));
            local_678._0_8_ = local_718;
            local_5f8._M_next = &local_5f8;
            local_5e8 = 0;
            local_600 = &PTR__SimpleArray_00109c58;
            local_608 = pDVar5;
            local_5f8._M_prev = &local_5f8;
            (**(code **)(*plVar4 + 0x10))(&local_570,plVar4,local_720 + 1);
            Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
            Kumu::Result_t::~Result_t((Result_t *)&local_570);
            if (-1 < local_700[0]) {
              ASDCP::MXF::SeekToRIP((IFileReader *)&local_570);
              Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
              Kumu::Result_t::~Result_t((Result_t *)&local_570);
              if (local_700[0] < 0) {
                pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error(pIVar6,"read_mxf SeekToRIP failed: %s\n",local_6f8);
              }
              else {
                ASDCP::MXF::RIP::InitFromFile((IFileReader *)&local_570);
                Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
                Kumu::Result_t::~Result_t((Result_t *)&local_570);
                if (local_700[0] < 0) {
                  pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
                  Kumu::ILogSink::Error(pIVar6,"File contains no RIP\n");
                  Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)Kumu::RESULT_OK);
                }
                else if (local_5f8._M_next == &local_5f8) {
                  pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
                  Kumu::ILogSink::Error(pIVar6,"RIP contains no Pairs.\n");
                }
                (**(code **)(*plVar4 + 0x28))(local_100,plVar4,0,0);
                Kumu::Result_t::~Result_t(local_100);
              }
            }
            if (-1 < local_700[0]) {
              ASDCP::MXF::OP1aHeader::InitFromFile((IFileReader *)&local_570);
              Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
              Kumu::Result_t::~Result_t((Result_t *)&local_570);
            }
            if (-1 < local_700[0]) {
              ASDCP::MXF::OP1aHeader::Dump((_IO_FILE *)local_3e8);
            }
            if ((-1 < local_700[0]) && (2 < local_5e8)) {
              p_Var10 = (((_List_impl *)&(local_5f8._M_next)->_M_next)->_M_node).
                        super__List_node_base._M_next;
              while ((p_Var10 != &local_5f8 && (-1 < local_700[0]))) {
                (**(code **)(*plVar4 + 0x28))(&local_570,plVar4,p_Var10[2]._M_next);
                Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
                Kumu::Result_t::~Result_t((Result_t *)&local_570);
                if (-1 < local_700[0]) {
                  ASDCP::MXF::Partition::Partition((Partition *)&local_570,pDVar5);
                  ASDCP::MXF::Partition::InitFromFile((IFileReader *)local_5d8);
                  Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)local_5d8);
                  Kumu::Result_t::~Result_t((Result_t *)local_5d8);
                  if ((-1 < local_700[0]) && (local_570._mode != 0)) {
                    ASDCP::MXF::Partition::Dump(&local_570);
                  }
                  ASDCP::MXF::Partition::~Partition((Partition *)&local_570);
                }
                p_Var10 = p_Var10->_M_next;
              }
            }
            pcVar8 = local_710;
            if (-1 < local_700[0]) {
              ASDCP::MXF::OPAtomIndexFooter::OPAtomIndexFooter
                        ((OPAtomIndexFooter *)&local_570,pDVar5);
              (**(code **)(*plVar4 + 0x28))((Result_t *)local_5d8,plVar4,local_350,0);
              Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)local_5d8);
              Kumu::Result_t::~Result_t((Result_t *)local_5d8);
              if (-1 < local_700[0]) {
                local_3f0 = local_238;
                ASDCP::MXF::OPAtomIndexFooter::InitFromFile((IFileReader *)local_5d8);
                Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)local_5d8);
                Kumu::Result_t::~Result_t((Result_t *)local_5d8);
              }
              if (-1 < local_700[0]) {
                ASDCP::MXF::OPAtomIndexFooter::Dump(&local_570);
              }
              ASDCP::MXF::OPAtomIndexFooter::~OPAtomIndexFooter((OPAtomIndexFooter *)&local_570);
            }
            if (-1 < local_700[0]) {
              ASDCP::MXF::RIP::Dump((_IO_FILE *)local_678);
            }
            local_678._0_8_ = local_718;
            std::__cxx11::
            _List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
            ::_M_clear((_List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                        *)&local_5f8);
LAB_00106112:
            local_678._0_8_ = pcVar8;
            ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)(local_678 + 0x48));
            ASDCP::MXF::OP1aHeader::~OP1aHeader((OP1aHeader *)local_3e8);
          }
          else {
            if (local_698.walk_parts_flag == true) {
              pDVar5 = (Dictionary *)ASDCP::DefaultCompositeDict();
              ASDCP::MXF::OP1aHeader::OP1aHeader((OP1aHeader *)local_3e8,pDVar5);
              local_678._8_8_ = (char *)0x0;
              local_668 = 0;
              local_648 = (char *)0x0;
              pcStack_640 = (char *)0x0;
              local_638 = 0;
              local_660 = (char *)0x0;
              pcStack_658 = (char *)0x0;
              local_650 = &PTR__IArchive_00109be8;
              local_678._0_8_ = pcVar8;
              ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)(local_678 + 0x48));
              local_678._0_8_ = local_718;
              local_5f8._M_next = &local_5f8;
              local_5e8 = 0;
              local_600 = &PTR__SimpleArray_00109c58;
              local_608 = pDVar5;
              local_5f8._M_prev = &local_5f8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_5d8,(char *)local_720[1]._M_next,&local_721);
              (**(code **)(*plVar4 + 0x10))(&local_570,plVar4,(string *)local_5d8);
              Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
              Kumu::Result_t::~Result_t((Result_t *)&local_570);
              if (local_5d8[0] != local_5c8) {
                operator_delete(local_5d8[0],(long)local_5c8[0] + 1);
              }
              if (-1 < local_700[0]) {
                ASDCP::MXF::SeekToRIP((IFileReader *)&local_570);
                Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
                Kumu::Result_t::~Result_t((Result_t *)&local_570);
              }
              if (local_700[0] < 0) {
                pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error(pIVar6,"walk_parts SeekToRIP failed: %s\n",local_6f8);
              }
              else {
                ASDCP::MXF::RIP::InitFromFile((IFileReader *)&local_570);
                Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
                Kumu::Result_t::~Result_t((Result_t *)&local_570);
                if (local_700[0] < 0) {
                  pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
                  Kumu::ILogSink::Error(pIVar6,"File contains no RIP\n");
                  Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)Kumu::RESULT_OK);
                }
                else if (local_5f8._M_next == &local_5f8) {
                  pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
                  Kumu::ILogSink::Error(pIVar6,"RIP contains no Pairs.\n");
                }
                (**(code **)(*plVar4 + 0x28))(local_168,plVar4,0,0);
                Kumu::Result_t::~Result_t(local_168);
              }
              if (-1 < local_700[0]) {
                ASDCP::MXF::RIP::Dump((_IO_FILE *)local_678);
                for (p_Var10 = local_5f8._M_next; p_Var10 != &local_5f8;
                    p_Var10 = (((_List_impl *)&p_Var10->_M_next)->_M_node).super__List_node_base.
                              _M_next) {
                  (**(code **)(*plVar4 + 0x28))(local_98,plVar4,p_Var10[2]._M_next,0);
                  Kumu::Result_t::~Result_t(local_98);
                  ASDCP::MXF::Partition::Partition((Partition *)&local_570,pDVar5);
                  ASDCP::MXF::Partition::InitFromFile(local_1d0);
                  Kumu::Result_t::~Result_t((Result_t *)local_1d0);
                  if ((_List_node_base *)local_570._lock != p_Var10[2]._M_next) {
                    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
                    Kumu::ILogSink::Error
                              (pIVar6,"ThisPartition value error: wanted=%qu, got=%qu\n",
                               local_570._lock);
                  }
                  ASDCP::MXF::Partition::Dump(&local_570);
                  ASDCP::MXF::Partition::~Partition((Partition *)&local_570);
                }
              }
              local_678._0_8_ = local_718;
              std::__cxx11::
              _List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
              ::_M_clear((_List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                          *)&local_5f8);
              pcVar8 = local_710;
              goto LAB_00106112;
            }
            local_3e8._8_8_ = (char *)0x0;
            local_3e8._16_4_ = 0;
            local_3e8._48_8_ = (char *)0x0;
            local_3e8._56_8_ = (char *)0x0;
            local_3e8[0x40] = 0;
            local_3e8._24_8_ = (char *)0x0;
            local_3e8._32_8_ = (char *)0x0;
            local_3e8._40_8_ = &PTR__IArchive_00109be8;
            local_3e8._0_8_ = pcVar8;
            ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)(local_3e8 + 0x48));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_678,(char *)local_720[1]._M_next,(allocator<char> *)local_5d8
                      );
            (**(code **)(*plVar4 + 0x10))(&local_570,plVar4,(string *)local_678);
            Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
            Kumu::Result_t::~Result_t((Result_t *)&local_570);
            if ((undefined1 *)local_678._0_8_ != local_678 + 0x10) {
              operator_delete((void *)local_678._0_8_,CONCAT44(uStack_664,local_668) + 1);
            }
            if (-1 < local_700[0]) {
              ASDCP::KLVFilePacket::InitFromFile((IFileReader *)&local_570);
              Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
              Kumu::Result_t::~Result_t((Result_t *)&local_570);
            }
            if (-1 < local_700[0]) {
              pcVar9 = (code *)0x0;
              do {
                fprintf(_stdout,"@0x%08llx: ",pcVar9);
                pFVar1 = _stdout;
                bVar2 = (bool)ASDCP::DefaultCompositeDict();
                ASDCP::KLVPacket::Dump((_IO_FILE *)local_3e8,(Dictionary *)pFVar1,bVar2);
                (**(code **)(*plVar4 + 0x30))(&local_570,plVar4,local_678);
                Kumu::Result_t::~Result_t((Result_t *)&local_570);
                pcVar9 = (code *)local_678._0_8_;
                ASDCP::KLVFilePacket::InitFromFile((IFileReader *)&local_570);
                Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)&local_570);
                Kumu::Result_t::~Result_t((Result_t *)&local_570);
                if ((local_700[0] == Kumu::RESULT_ALLOC) && (local_698.allow_skip_flag == true)) {
                  fwrite("Skipping huge packet, reporting zero packet size.\n",0x32,1,_stdout);
                  Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)Kumu::RESULT_OK);
                }
              } while (-1 < local_700[0]);
            }
            if (local_700[0] == Kumu::RESULT_ENDOFFILE) {
              Kumu::Result_t::operator=((Result_t *)local_700,(Result_t *)Kumu::RESULT_OK);
            }
            local_3e8._0_8_ = pcVar8;
            ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)(local_3e8 + 0x48));
          }
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 8))(plVar4);
          }
        } while ((-1 < local_700[0]) &&
                (local_720 = local_720->_M_next,
                local_720 != (_List_node_base *)&local_698.inFileList));
      }
      iVar7 = 0;
      if (local_700[0] < 0) {
        main_cold_2();
        iVar7 = local_3e8._0_4_;
      }
      Kumu::Result_t::~Result_t((Result_t *)local_700);
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_698.inFileList.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return iVar7;
}

Assistant:

int
main(int argc, const char** argv)
{
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  FileList_t::iterator fi;
  Result_t result = RESULT_OK;
  Kumu::FileReaderFactory defaultFactory;

  for ( fi = Options.inFileList.begin(); ASDCP_SUCCESS(result) && fi != Options.inFileList.end(); fi++ )
    {
      ASDCP::mem_ptr<Kumu::IFileReader> Reader(defaultFactory.CreateFileReader());
      if (Options.verbose_flag)
	fprintf(stderr, "Opening file %s\n", ((*fi).c_str()));
      
      if ( Options.read_mxf_flag ) // dump MXF
	{      
	  const Dictionary* Dict = &DefaultCompositeDict();
	  ASDCP::MXF::OP1aHeader Header(Dict);
	  ASDCP::MXF::RIP RIP(Dict);
	  
	  result = Reader->OpenRead(*fi);
	  
	  if ( ASDCP_SUCCESS(result) )
	    {
		  result = MXF::SeekToRIP(*Reader);
	      
	      if ( ASDCP_SUCCESS(result) )
		{
		  result = RIP.InitFromFile(*Reader);
		  ui32_t test_s = RIP.PairArray.size();

		  if ( ASDCP_FAILURE(result) )
		    {
		      DefaultLogSink().Error("File contains no RIP\n");
		      result = RESULT_OK;
		    }
		  else if ( RIP.PairArray.empty() )
		    {
		      DefaultLogSink().Error("RIP contains no Pairs.\n");
		    }

		  Reader->Seek(0);
		}
	      else
		{
		  DefaultLogSink().Error("read_mxf SeekToRIP failed: %s\n", result.Label());
		}
	    }

	  if ( ASDCP_SUCCESS(result) )
        result = Header.InitFromFile(*Reader);
	  
	  if ( ASDCP_SUCCESS(result) )
	    Header.Dump(stdout);
	  
	  if ( ASDCP_SUCCESS(result) && RIP.PairArray.size() > 2 )
	    {
	      MXF::RIP::const_pair_iterator pi = RIP.PairArray.begin();

	      for ( pi++; pi != RIP.PairArray.end() && ASDCP_SUCCESS(result); pi++ )
		{
		  result = Reader->Seek((*pi).ByteOffset);

		  if ( ASDCP_SUCCESS(result) )
		    {
		      MXF::Partition TmpPart(Dict);
              result = TmpPart.InitFromFile(*Reader);

		      if ( ASDCP_SUCCESS(result) && TmpPart.BodySID > 0 )
			TmpPart.Dump(stdout);
		    }
		}
	    }

	  if ( ASDCP_SUCCESS(result) )
	    {
	      ASDCP::MXF::OPAtomIndexFooter Index(Dict);
	      result = Reader->Seek(Header.FooterPartition);
	      
	      if ( ASDCP_SUCCESS(result) )
		{
		  Index.m_Lookup = &Header.m_Primer;
          result = Index.InitFromFile(*Reader);
		}
	      
	      if ( ASDCP_SUCCESS(result) )
		Index.Dump(stdout);
	    }

	  if ( ASDCP_SUCCESS(result) )
	    RIP.Dump(stdout);
	}
      else if ( Options.walk_parts_flag )
	{
	  const Dictionary* Dict = &DefaultCompositeDict();
	  ASDCP::MXF::OP1aHeader Header(Dict);
	  ASDCP::MXF::RIP RIP(Dict);
	  
	  result = Reader->OpenRead((*fi).c_str());
	  
	  if ( ASDCP_SUCCESS(result) )
        result = MXF::SeekToRIP(*Reader);

	  if ( ASDCP_SUCCESS(result) )
	    {
          result = RIP.InitFromFile(*Reader);
	      ui32_t test_s = RIP.PairArray.size();

	      if ( ASDCP_FAILURE(result) )
		{
		  DefaultLogSink().Error("File contains no RIP\n");
		  result = RESULT_OK;
		}
	      else if ( RIP.PairArray.empty() )
		{
		  DefaultLogSink().Error("RIP contains no Pairs.\n");
		}

	      Reader->Seek(0);
	    }
	  else
	    {
	      DefaultLogSink().Error("walk_parts SeekToRIP failed: %s\n", result.Label());
	    }

	  if ( ASDCP_SUCCESS(result) )
	    {
	      RIP.Dump();

	      MXF::RIP::const_pair_iterator i;
	      for ( i = RIP.PairArray.begin(); i != RIP.PairArray.end(); ++i )
		{
		  Reader->Seek(i->ByteOffset);
		  MXF::Partition plain_part(Dict);
          plain_part.InitFromFile(*Reader);

		  if ( plain_part.ThisPartition != i->ByteOffset )
		    {
		      DefaultLogSink().Error("ThisPartition value error: wanted=%qu, got=%qu\n",
					     plain_part.ThisPartition, i->ByteOffset);
		    }

		  plain_part.Dump();
		}
	    }
	}
      else // dump klv
	{      
	  KLVFilePacket KP;
	  ui64_t pos = 0;

	  result = Reader->OpenRead((*fi).c_str());
	  
	  if ( ASDCP_SUCCESS(result) )
	    result = KP.InitFromFile(*Reader);
	  
	  while ( ASDCP_SUCCESS(result) )
	    {
	      fprintf(stdout, "@0x%08llx: ", pos);
	      KP.Dump(stdout, DefaultCompositeDict(), true);
	      pos = Reader->TellPosition();
	      result = KP.InitFromFile(*Reader);

              if ( result == RESULT_ALLOC && Options.allow_skip_flag )
                {
                  fprintf(stdout, "Skipping huge packet, reporting zero packet size.\n");
                  result = RESULT_OK;
                }
            }
	  
	  if( result == RESULT_ENDOFFILE )
	    result = RESULT_OK;
	}
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);
      
      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}
      
      return 1;
    }
  
  return 0;
}